

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

FenceWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateFence
          (FenceWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,VkFenceCreateInfo *FenceCI
          ,char *DebugName)

{
  string msg;
  string local_48;
  
  if (FenceCI->sType != VK_STRUCTURE_TYPE_FENCE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[53]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"FenceCI.sType == VK_STRUCTURE_TYPE_FENCE_CREATE_INFO",
               (char (*) [53])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xe0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkFence_T*,(VulkanUtilities::VulkanHandleTypeId)7,VkResult(*)(VkDevice_T*,VkFenceCreateInfo_const*,VkAllocationCallbacks_const*,VkFence_T**),VkFenceCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkFenceCreateInfo_ptr_VkAllocationCallbacks_ptr_VkFence_T_ptr_ptr
              *)vkCreateFence,FenceCI,DebugName,"fence");
  return __return_storage_ptr__;
}

Assistant:

FenceWrapper VulkanLogicalDevice::CreateFence(const VkFenceCreateInfo& FenceCI, const char* DebugName) const
{
    VERIFY_EXPR(FenceCI.sType == VK_STRUCTURE_TYPE_FENCE_CREATE_INFO);
    return CreateVulkanObject<VkFence, VulkanHandleTypeId::Fence>(vkCreateFence, FenceCI, DebugName, "fence");
}